

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

void on_data(intptr_t sockfd,fio_protocol_s *ws_)

{
  _func_void_intptr_t_fio_protocol_s_ptr *buffer;
  ssize_t sVar1;
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var2;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var3;
  websocket_packet_info_s wVar4;
  buffer_s bVar5;
  buffer_s buff;
  
  if (ws_ != (fio_protocol_s *)0x0) {
    buffer = ws_[3].on_data;
    p_Var2 = ws_[3].on_shutdown;
    wVar4 = websocket_buffer_peek(buffer,(uint64_t)p_Var2);
    p_Var3 = (_func_void_intptr_t_fio_protocol_s_ptr *)((wVar4._8_8_ & 0xff) + wVar4.packet_length);
    if (ws_[2].on_ready < p_Var3) {
LAB_0014f11e:
      websocket_close((ws_s *)ws_);
      return;
    }
    bVar5.size = (size_t)ws_[3].on_ready;
    bVar5.data = buffer;
    if (ws_[3].on_ready < p_Var3) {
      ws_[3].on_ready = p_Var3;
      buff.size = (size_t)p_Var3;
      buff.data = buffer;
      bVar5 = resize_ws_buffer((ws_s *)ws_,buff);
      ws_[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar5.data;
      ws_[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar5.size;
      if (bVar5.data == (void *)0x0) goto LAB_0014f11e;
      p_Var2 = ws_[3].on_shutdown;
    }
    sVar1 = fio_read(sockfd,(_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
                            ((long)bVar5.data + (long)p_Var2),bVar5.size - (long)p_Var2);
    if (0 < sVar1) {
      p_Var2 = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
               websocket_consume(ws_[3].on_data,(uint64_t)(ws_[3].on_shutdown + sVar1),ws_,
                                 ~*(byte *)((long)&ws_[3].ping + 1) & 1);
      ws_[3].on_shutdown = p_Var2;
      fio_force_event(sockfd,FIO_EVENT_ON_DATA);
      return;
    }
  }
  return;
}

Assistant:

static void on_data(intptr_t sockfd, fio_protocol_s *ws_) {
  ws_s *const ws = (ws_s *)ws_;
  if (ws == NULL)
    return;
  struct websocket_packet_info_s info =
      websocket_buffer_peek(ws->buffer.data, ws->length);
  const uint64_t raw_length = info.packet_length + info.head_length;
  /* test expected data amount */
  if (ws->max_msg_size < raw_length) {
    /* too big */
    websocket_close(ws);
    return;
  }
  /* test buffer capacity */
  if (raw_length > ws->buffer.size) {
    ws->buffer.size = (size_t)raw_length;
    ws->buffer = resize_ws_buffer(ws, ws->buffer);
    if (!ws->buffer.data) {
      // no memory.
      websocket_close(ws);
      return;
    }
  }

  const ssize_t len = fio_read(sockfd, (uint8_t *)ws->buffer.data + ws->length,
                               ws->buffer.size - ws->length);
  if (len <= 0) {
    return;
  }
  ws->length = websocket_consume(ws->buffer.data, ws->length + len, ws,
                                 (~(ws->is_client) & 1));

  fio_force_event(sockfd, FIO_EVENT_ON_DATA);
}